

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt__matches(stbtt_uint8 *fc,stbtt_uint32 offset,stbtt_uint8 *name,stbtt_int32 flags)

{
  stbtt_uint16 sVar1;
  stbtt_int32 nlen_00;
  int iVar2;
  stbtt_uint32 sVar3;
  size_t sVar4;
  stbtt_uint32 hd;
  stbtt_uint32 nm;
  stbtt_int32 nlen;
  stbtt_int32 flags_local;
  stbtt_uint8 *name_local;
  stbtt_uint32 offset_local;
  stbtt_uint8 *fc_local;
  
  sVar4 = strlen((char *)name);
  nlen_00 = (stbtt_int32)sVar4;
  iVar2 = stbtt__isfont(fc + offset);
  if (iVar2 != 0) {
    if (flags != 0) {
      sVar3 = stbtt__find_table(fc,offset,"head");
      sVar1 = ttUSHORT(fc + (ulong)sVar3 + 0x2c);
      if ((sVar1 & 7) != (flags & 7U)) {
        return 0;
      }
    }
    sVar3 = stbtt__find_table(fc,offset,"name");
    if (sVar3 != 0) {
      if (flags == 0) {
        iVar2 = stbtt__matchpair(fc,sVar3,name,nlen_00,0x10,0x11);
        if (iVar2 != 0) {
          return 1;
        }
        iVar2 = stbtt__matchpair(fc,sVar3,name,nlen_00,1,2);
        if (iVar2 != 0) {
          return 1;
        }
        iVar2 = stbtt__matchpair(fc,sVar3,name,nlen_00,3,-1);
        if (iVar2 != 0) {
          return 1;
        }
      }
      else {
        iVar2 = stbtt__matchpair(fc,sVar3,name,nlen_00,0x10,-1);
        if (iVar2 != 0) {
          return 1;
        }
        iVar2 = stbtt__matchpair(fc,sVar3,name,nlen_00,1,-1);
        if (iVar2 != 0) {
          return 1;
        }
        iVar2 = stbtt__matchpair(fc,sVar3,name,nlen_00,3,-1);
        if (iVar2 != 0) {
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int stbtt__matches(stbtt_uint8 *fc, stbtt_uint32 offset, stbtt_uint8 *name, stbtt_int32 flags)
{
   stbtt_int32 nlen = (stbtt_int32) STBTT_strlen((char *) name);
   stbtt_uint32 nm,hd;
   if (!stbtt__isfont(fc+offset)) return 0;

   // check italics/bold/underline flags in macStyle...
   if (flags) {
      hd = stbtt__find_table(fc, offset, "head");
      if ((ttUSHORT(fc+hd+44) & 7) != (flags & 7)) return 0;
   }

   nm = stbtt__find_table(fc, offset, "name");
   if (!nm) return 0;

   if (flags) {
      // if we checked the macStyle flags, then just check the family and ignore the subfamily
      if (stbtt__matchpair(fc, nm, name, nlen, 16, -1))  return 1;
      if (stbtt__matchpair(fc, nm, name, nlen,  1, -1))  return 1;
      if (stbtt__matchpair(fc, nm, name, nlen,  3, -1))  return 1;
   } else {
      if (stbtt__matchpair(fc, nm, name, nlen, 16, 17))  return 1;
      if (stbtt__matchpair(fc, nm, name, nlen,  1,  2))  return 1;
      if (stbtt__matchpair(fc, nm, name, nlen,  3, -1))  return 1;
   }

   return 0;
}